

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_utils.hpp
# Opt level: O3

String * __thiscall
Args::eatOneValue<Args::CmdLine,Args::Context>
          (String *__return_storage_ptr__,Args *this,Context *context,String *errorDescription,
          CmdLine *cmdLine)

{
  String *name;
  pointer pcVar1;
  pointer pbVar2;
  ArgIface *pAVar3;
  logic_error *this_00;
  uint *local_48;
  undefined8 local_40;
  uint local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  name = *(String **)(this + 0x18);
  if (name != *(String **)(this + 8)) {
    *(String **)(this + 0x18) = name + 1;
    pAVar3 = CmdLine::findArgument((CmdLine *)errorDescription,name);
    if (pAVar3 == (ArgIface *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + name->_M_string_length);
      return __return_storage_ptr__;
    }
    if (*(long *)(this + 0x18) != *(long *)this) {
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + -0x20;
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x30);
  pbVar2 = (context->m_context).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pbVar2,
             (long)&(((context->m_context).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p + (long)pbVar2)
  ;
  std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
  *(undefined ***)this_00 = &PTR__BaseException_0010bd98;
  *(logic_error **)(this_00 + 0x10) = this_00 + 0x20;
  if (local_48 == &local_38) {
    *(uint *)(this_00 + 0x20) = local_38;
    *(undefined4 *)(this_00 + 0x24) = uStack_34;
    *(undefined4 *)(this_00 + 0x28) = uStack_30;
    *(undefined4 *)(this_00 + 0x2c) = uStack_2c;
  }
  else {
    *(uint **)(this_00 + 0x10) = local_48;
    *(ulong *)(this_00 + 0x20) = CONCAT44(uStack_34,local_38);
  }
  *(undefined8 *)(this_00 + 0x18) = local_40;
  local_40 = 0;
  local_38 = local_38 & 0xffffff00;
  local_48 = &local_38;
  __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

String eatOneValue( Ctx & context,
	const String & errorDescription, Cmd * cmdLine )
{
	if( !context.atEnd() )
	{
		auto val = context.next();

		if( !cmdLine->findArgument( *val ) )
			return *val;

		context.putBack();
	}

	throw BaseException( errorDescription );
}